

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_interaction.cpp
# Opt level: O3

int UseHealthItems(TArray<AInventory_*,_AInventory_*> *Items,int *saveHealth)

{
  int *piVar1;
  AInventory *pAVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  
  uVar8 = Items->Count;
  iVar13 = *saveHealth;
  iVar12 = 0;
  if (0 < iVar13 && uVar8 != 0) {
    iVar12 = 0;
    do {
      uVar9 = 0xffffffff;
      uVar11 = 0;
      iVar3 = 0;
      do {
        iVar6 = iVar3;
        iVar10 = (Items->Array[uVar11]->super_AActor).health;
        iVar3 = iVar6;
        if (iVar6 < iVar10) {
          uVar9 = uVar11 & 0xffffffff;
          iVar3 = iVar10;
        }
        uVar11 = uVar11 + 1;
      } while (uVar8 != uVar11);
      uVar11 = (long)(iVar13 + iVar3 + -1) / (long)iVar3;
      uVar5 = uVar11 & 0xffffffff;
      iVar13 = (int)uVar11;
      if (0 < iVar13) {
        uVar8 = (uint)uVar9;
        pAVar2 = Items->Array[(int)uVar8];
        iVar7 = iVar13 * iVar3 + iVar12;
        iVar13 = iVar12;
        if (iVar10 < iVar6) {
          iVar10 = iVar6;
        }
        do {
          iVar13 = iVar13 + iVar10;
          *saveHealth = *saveHealth - iVar3;
          piVar1 = &pAVar2->Amount;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            (*(pAVar2->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x25])();
            iVar12 = iVar13;
            if (uVar8 < Items->Count) {
              uVar4 = Items->Count - 1;
              Items->Count = uVar4;
              if (uVar8 <= uVar4 && uVar4 - uVar8 != 0) {
                memmove(Items->Array + uVar9,Items->Array + uVar9 + 1,(ulong)(uVar4 - uVar8) << 3);
              }
            }
            break;
          }
          uVar4 = (int)uVar5 - 1;
          uVar5 = (ulong)uVar4;
          iVar12 = iVar7;
        } while (uVar4 != 0);
      }
      uVar8 = Items->Count;
    } while ((uVar8 != 0) && (iVar13 = *saveHealth, 0 < iVar13));
  }
  return iVar12;
}

Assistant:

static int UseHealthItems(TArray<AInventory *> &Items, int &saveHealth)
{
	int saved = 0;

	while (Items.Size() > 0 && saveHealth > 0)
	{
		int maxhealth = 0;
		int index = -1;

		// Find the largest item in the list
		for(unsigned i = 0; i < Items.Size(); i++)
		{
			if (Items[i]->health > maxhealth)
			{
				index = i;
				maxhealth = Items[i]->health;
			}
		}

		// Now apply the health items, using the same logic as Heretic and Hexen.
		int count = (saveHealth + maxhealth-1) / maxhealth;
		for(int i = 0; i < count; i++)
		{
			saved += maxhealth;
			saveHealth -= maxhealth;
			if (--Items[index]->Amount == 0)
			{
				Items[index]->DepleteOrDestroy ();
				Items.Delete(index);
				break;
			}
		}
	}
	return saved;
}